

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpool.h
# Opt level: O0

void __thiscall CVmPoolPaged::~CVmPoolPaged(CVmPoolPaged *this)

{
  CVmPoolPaged *in_RDI;
  
  ~CVmPoolPaged(in_RDI);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

virtual ~CVmPoolPaged() { terminate_nv(); }